

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFParsingUtils.h
# Opt level: O0

bool iDynTree::vector4FromString(string *vector_str,Vector4 *out)

{
  value_type vVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  char *pcVar5;
  reference pvVar6;
  double *pdVar7;
  VectorFixSize<4U> *in_RSI;
  string *in_RDI;
  string *unaff_retaddr;
  string errStr_1;
  string errStr;
  double newDouble;
  uint i;
  vector<double,_std::allocator<double>_> rgba;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pieces;
  char *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  pointer pdVar8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  size_t sVar9;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [36];
  undefined4 local_a4;
  string local_a0 [32];
  string local_80 [40];
  uint local_58;
  vector<double,_std::allocator<double>_> local_48;
  pointer in_stack_ffffffffffffffd8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar10;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1b8d19);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1b8d26);
  splitString(unaff_retaddr,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  local_58 = 0;
  do {
    uVar3 = (ulong)local_58;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffffd0);
    if (sVar4 <= uVar3) {
      sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_48);
      if (sVar4 == 4) {
        sVar9 = 0;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,0);
        vVar1 = *pvVar6;
        pdVar7 = VectorFixSize<4U>::operator()(in_RSI,sVar9);
        *pdVar7 = vVar1;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,1);
        vVar1 = *pvVar6;
        pdVar7 = VectorFixSize<4U>::operator()(in_RSI,1);
        *pdVar7 = vVar1;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,2);
        vVar1 = *pvVar6;
        pdVar7 = VectorFixSize<4U>::operator()(in_RSI,2);
        *pdVar7 = vVar1;
        sVar9 = 3;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,3);
        pdVar8 = (pointer)*pvVar6;
        in_stack_fffffffffffffe50 =
             (vector<double,_std::allocator<double>_> *)VectorFixSize<4U>::operator()(in_RSI,sVar9);
        (in_stack_fffffffffffffe50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start = pdVar8;
        bVar10 = 1;
        local_a4 = 1;
      }
      else {
        std::vector<double,_std::allocator<double>_>::size(&local_48);
        intToString_abi_cxx11_((size_t)in_stack_ffffffffffffffd8);
        std::operator+((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
        std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
        std::__cxx11::string::~string(local_e8);
        std::__cxx11::string::~string(local_108);
        std::__cxx11::string::~string(local_128);
        std::__cxx11::string::~string(local_148);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("","vector4FromString",pcVar5);
        bVar10 = 0;
        local_a4 = 1;
        std::__cxx11::string::~string(local_c8);
      }
LAB_001b9234:
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe50);
      return (bool)(bVar10 & 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffffd0,(ulong)local_58);
    bVar2 = std::operator!=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffffd0,(ulong)local_58);
      bVar2 = stringToDoubleWithClassicLocale(in_RDI,in_RSI->m_data);
      if (!bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xffffffffffffffd0,(ulong)local_58);
        std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
        std::__cxx11::string::~string(local_a0);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("","vector4FromString",pcVar5);
        bVar10 = 0;
        local_a4 = 1;
        std::__cxx11::string::~string(local_80);
        goto LAB_001b9234;
      }
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffe50,(value_type_conflict2 *)in_stack_fffffffffffffe48);
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

bool inline vector4FromString(const std::string & vector_str, Vector4 & out)
{
    std::vector<std::string> pieces;
    std::vector<double> rgba;
    splitString(vector_str,pieces);
    for (unsigned int i = 0; i < pieces.size(); ++i)
    {
      if (pieces[i] != ""){
       double newDouble;
       if( stringToDoubleWithClassicLocale(pieces[i],newDouble) )
       {
          rgba.push_back(newDouble);
       }
       else
       {
           std::string errStr = "Unable to parse component [" + pieces[i] + "] to a double (while parsing a vector value)";
           reportError("","vector4FromString",errStr.c_str());
           return false;
       }
      }
    }

    if (rgba.size() != 4)
    {
        std::string errStr = "Parser found " + intToString(rgba.size())  + " elements but 4 expected while parsing vector [" + vector_str + "]";
        reportError("","vector4FromString",errStr.c_str());
        return false;
    }

    out(0) = rgba[0];
    out(1) = rgba[1];
    out(2) = rgba[2];
    out(3) = rgba[3];

    return true;
}